

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyb_gga_xc_b1wc.c
# Opt level: O3

void xc_hyb_gga_xc_mpw1pw_init(xc_func_type *p)

{
  int iVar1;
  undefined4 uVar2;
  double funcs_coef [2];
  int local_20 [2];
  double local_18 [2];
  
  local_20[0] = 0x77;
  local_20[1] = 0;
  local_18[0] = 1.0;
  local_18[1] = 1.0;
  iVar1 = p->info->number;
  if (iVar1 == 0x1a2) {
    uVar2 = 0x86;
  }
  else {
    uVar2 = 0x83;
    if (iVar1 != 0x1e3) {
      if (iVar1 != 0x1e4) {
        xc_hyb_gga_xc_mpw1pw_init_cold_1();
        xc_mix_init(p,2,xc_hyb_gga_xc_mpw1k_init::funcs_id,xc_hyb_gga_xc_mpw1k_init::funcs_coef);
        xc_hyb_init_hybrid(p,0.0);
        return;
      }
      uVar2 = 0x82;
    }
  }
  local_20[1] = uVar2;
  local_20[0] = 0x77;
  xc_mix_init(p,2,local_20,local_18);
  xc_hyb_init_hybrid(p,0.0);
  return;
}

Assistant:

void
xc_hyb_gga_xc_mpw1pw_init(xc_func_type *p)
{
  int   funcs_id  [2] = {XC_GGA_X_MPW91, 0};
  double funcs_coef[2] = {1.0, 1.0};

  switch(p->info->number) {
  case(XC_HYB_GGA_XC_MPW1LYP):
    funcs_id[1]=XC_GGA_C_LYP;
    break;
  case(XC_HYB_GGA_XC_MPW1PBE):
    funcs_id[1]=XC_GGA_C_PBE;
    break;
  case(XC_HYB_GGA_XC_MPW1PW):
    funcs_id[1]=XC_GGA_C_PW91;
    break;
  default:
    fprintf(stderr,"Error in hyb_gga_xc_mpw1pw_init\n");
    fflush(stderr);
    exit(1);
  }

  xc_mix_init(p, 2, funcs_id, funcs_coef);
  xc_hyb_init_hybrid(p, 0.0);
}